

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::analyse_multiplicative_expression(Analyser *this)

{
  bool bVar1;
  Token *this_00;
  optional<Token> local_98;
  undefined4 local_70;
  Instruction local_6c;
  Instruction local_5c [2];
  TokenType local_3c;
  undefined1 local_38 [4];
  TokenType type;
  optional<Token> next;
  Analyser *this_local;
  
  next.super__Optional_base<Token,_false,_false>._M_payload.
  super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>._32_8_ =
       this;
  analyse_unary_expression(this);
  nextToken((optional<Token> *)local_38,this);
  do {
    bVar1 = std::optional<Token>::has_value((optional<Token> *)local_38);
    if (!bVar1) {
LAB_00128dcf:
      local_70 = 1;
      std::optional<Token>::~optional((optional<Token> *)local_38);
      return;
    }
    this_00 = std::optional<Token>::value((optional<Token> *)local_38);
    local_3c = Token::GetType(this_00);
    if (local_3c == MULTIPLICATION_SIGN) {
      analyse_unary_expression(this);
      Instruction::Instruction(local_5c,imul);
      addInstruction(this,local_5c);
    }
    else {
      if (local_3c != DIVISION_SIGN) {
        unreadToken(this);
        goto LAB_00128dcf;
      }
      analyse_unary_expression(this);
      Instruction::Instruction(&local_6c,idiv);
      addInstruction(this,&local_6c);
    }
    nextToken(&local_98,this);
    std::optional<Token>::operator=((optional<Token> *)local_38,&local_98);
    std::optional<Token>::~optional(&local_98);
  } while( true );
}

Assistant:

void Analyser::analyse_multiplicative_expression() {
	analyse_unary_expression();
	auto next = nextToken();

	while (next.has_value()) {
		auto type = next.value().GetType();
		switch (type)
		{
		case TokenType::MULTIPLICATION_SIGN:
			analyse_unary_expression();
			addInstruction(Instruction(Operation::imul));
			break;
		case TokenType::DIVISION_SIGN:
			analyse_unary_expression();
			addInstruction(Instruction(Operation::idiv));
			break;
		default:
			unreadToken();
			return;
		}
		next = nextToken();
	}
	return;
}